

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<8> *ray,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  undefined1 auVar5 [32];
  undefined1 (*pauVar6) [16];
  int iVar7;
  undefined4 uVar8;
  float *vertices;
  undefined1 (*pauVar9) [16];
  RayHitK<8> *pRVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  Scene *pSVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  Geometry *pGVar25;
  ulong uVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [32];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar51 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  undefined1 auVar96 [64];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [64];
  float fVar104;
  float fVar106;
  float fVar107;
  undefined1 auVar105 [16];
  float fVar108;
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar114 [16];
  float fVar115;
  float fVar118;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar119;
  float fVar120;
  float fVar123;
  float fVar124;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar128 [16];
  float fVar134;
  Scene *scene;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  RayHitK<8> local_13e9;
  ulong local_13e8;
  undefined1 local_13e0 [16];
  undefined1 local_13d0 [16];
  undefined1 local_13c0 [16];
  size_t local_13a8;
  RayHitK<8> *local_13a0;
  Scene *local_1398;
  undefined1 local_1390 [16];
  undefined1 local_1380 [16];
  undefined1 local_1370 [16];
  undefined1 local_1360 [16];
  undefined1 local_1350 [16];
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  long local_1300;
  long local_12f8;
  ulong local_12f0;
  ulong local_12e8;
  undefined1 *local_12e0;
  void *local_12d8;
  RTCRayQueryContext *local_12d0;
  RayHitK<8> *local_12c8;
  undefined1 (*local_12c0) [32];
  undefined4 local_12b8;
  undefined1 local_12b0 [16];
  undefined8 local_12a0;
  undefined8 uStack_1298;
  float local_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined1 local_1280 [16];
  undefined1 local_1270 [16];
  RayHitK<8> *local_1260;
  undefined1 local_1250 [16];
  undefined1 local_1240 [16];
  undefined1 local_1230 [16];
  undefined1 local_1220 [16];
  undefined1 local_1210 [16];
  undefined1 local_1200 [16];
  undefined1 local_11f0 [16];
  undefined1 local_11e0 [32];
  float local_11b0;
  float fStack_11ac;
  float fStack_11a8;
  float fStack_11a4;
  float local_11a0;
  float fStack_119c;
  float fStack_1198;
  float fStack_1194;
  float local_1190;
  float fStack_118c;
  float fStack_1188;
  float fStack_1184;
  float local_1180;
  float fStack_117c;
  float fStack_1178;
  float fStack_1174;
  float local_1170;
  float fStack_116c;
  float fStack_1168;
  float fStack_1164;
  float local_1160;
  float fStack_115c;
  float fStack_1158;
  float fStack_1154;
  undefined1 local_1150 [16];
  undefined1 local_1140 [16];
  undefined1 local_1130 [16];
  undefined1 local_1120 [16];
  undefined1 local_1110 [16];
  undefined1 local_1100 [16];
  undefined8 local_10f0;
  undefined8 uStack_10e8;
  undefined1 local_10e0 [32];
  undefined1 local_10c0 [32];
  undefined1 local_10a0 [32];
  undefined1 local_1080 [32];
  undefined1 local_1060 [32];
  undefined4 local_1040;
  undefined4 uStack_103c;
  undefined4 uStack_1038;
  undefined4 uStack_1034;
  undefined4 uStack_1030;
  undefined4 uStack_102c;
  undefined4 uStack_1028;
  undefined4 uStack_1024;
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  uint local_fe0;
  uint uStack_fdc;
  uint uStack_fd8;
  uint uStack_fd4;
  uint uStack_fd0;
  uint uStack_fcc;
  uint uStack_fc8;
  uint uStack_fc4;
  uint local_fc0;
  uint uStack_fbc;
  uint uStack_fb8;
  uint uStack_fb4;
  uint uStack_fb0;
  uint uStack_fac;
  uint uStack_fa8;
  uint uStack_fa4;
  size_t local_fa0;
  undefined4 uStack_f98;
  undefined1 local_f90 [3936];
  undefined1 auVar58 [32];
  
  pauVar9 = (undefined1 (*) [16])local_f90;
  local_fa0 = root.ptr;
  uStack_f98 = 0;
  uVar8 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_1130._4_4_ = uVar8;
  local_1130._0_4_ = uVar8;
  local_1130._8_4_ = uVar8;
  local_1130._12_4_ = uVar8;
  auVar95 = ZEXT1664(local_1130);
  uVar8 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_1140._4_4_ = uVar8;
  local_1140._0_4_ = uVar8;
  local_1140._8_4_ = uVar8;
  local_1140._12_4_ = uVar8;
  auVar96 = ZEXT1664(local_1140);
  uVar8 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  local_1150._4_4_ = uVar8;
  local_1150._0_4_ = uVar8;
  local_1150._8_4_ = uVar8;
  local_1150._12_4_ = uVar8;
  auVar103 = ZEXT1664(local_1150);
  fVar119 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar125 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar134 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  fVar108 = fVar119 * 0.99999964;
  fVar112 = fVar125 * 0.99999964;
  fVar115 = fVar134 * 0.99999964;
  fVar119 = fVar119 * 1.0000004;
  fVar125 = fVar125 * 1.0000004;
  fVar134 = fVar134 * 1.0000004;
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_12e8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_12f0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar30 = uVar22 ^ 0x10;
  uVar31 = local_12e8 ^ 0x10;
  uVar29 = local_12f0 ^ 0x10;
  iVar7 = (tray->tnear).field_0.i[k];
  local_12b0._4_4_ = iVar7;
  local_12b0._0_4_ = iVar7;
  local_12b0._8_4_ = iVar7;
  local_12b0._12_4_ = iVar7;
  auVar88 = ZEXT1664(local_12b0);
  iVar7 = (tray->tfar).field_0.i[k];
  auVar41 = ZEXT1664(CONCAT412(iVar7,CONCAT48(iVar7,CONCAT44(iVar7,iVar7))));
  iVar7 = 1 << ((uint)k & 0x1f);
  auVar51._4_4_ = iVar7;
  auVar51._0_4_ = iVar7;
  auVar51._8_4_ = iVar7;
  auVar51._12_4_ = iVar7;
  auVar51._16_4_ = iVar7;
  auVar51._20_4_ = iVar7;
  auVar51._24_4_ = iVar7;
  auVar51._28_4_ = iVar7;
  auVar58 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar51 = vpand_avx2(auVar51,auVar58);
  local_10e0 = vpcmpeqd_avx2(auVar51,auVar58);
  local_1160 = fVar108;
  fStack_115c = fVar108;
  fStack_1158 = fVar108;
  fStack_1154 = fVar108;
  local_1170 = fVar112;
  fStack_116c = fVar112;
  fStack_1168 = fVar112;
  fStack_1164 = fVar112;
  local_1180 = fVar115;
  fStack_117c = fVar115;
  fStack_1178 = fVar115;
  fStack_1174 = fVar115;
  local_1190 = fVar119;
  fStack_118c = fVar119;
  fStack_1188 = fVar119;
  fStack_1184 = fVar119;
  local_11a0 = fVar125;
  fStack_119c = fVar125;
  fStack_1198 = fVar125;
  fStack_1194 = fVar125;
  local_11b0 = fVar134;
  fStack_11ac = fVar134;
  fStack_11a8 = fVar134;
  fStack_11a4 = fVar134;
  local_13a0 = ray;
  local_13a8 = k;
  local_13e8 = uVar22;
  fVar132 = fVar134;
  fVar130 = fVar134;
  fVar127 = fVar134;
  fVar124 = fVar125;
  fVar123 = fVar125;
  fVar120 = fVar125;
  fVar118 = fVar119;
  fVar133 = fVar119;
  fVar131 = fVar119;
  fVar129 = fVar115;
  fVar126 = fVar115;
  fVar113 = fVar115;
  fVar111 = fVar112;
  fVar110 = fVar112;
  fVar109 = fVar112;
  fVar107 = fVar108;
  fVar106 = fVar108;
  fVar104 = fVar108;
LAB_0056b18f:
  do {
    pauVar6 = pauVar9 + -1;
    pauVar9 = pauVar9 + -1;
    if (*(float *)(*pauVar6 + 8) <= *(float *)(ray + k * 4 + 0x100)) {
      uVar15 = *(ulong *)*pauVar9;
      while ((uVar15 & 8) == 0) {
        uVar11 = uVar15 & 0xfffffffffffffff0;
        uVar8 = *(undefined4 *)(ray + k * 4 + 0xe0);
        auVar42._4_4_ = uVar8;
        auVar42._0_4_ = uVar8;
        auVar42._8_4_ = uVar8;
        auVar42._12_4_ = uVar8;
        auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar22),auVar42,
                                  *(undefined1 (*) [16])(uVar11 + 0x20 + uVar22));
        auVar38 = vsubps_avx(auVar38,auVar95._0_16_);
        auVar43._0_4_ = fVar104 * auVar38._0_4_;
        auVar43._4_4_ = fVar106 * auVar38._4_4_;
        auVar43._8_4_ = fVar107 * auVar38._8_4_;
        auVar43._12_4_ = fVar108 * auVar38._12_4_;
        auVar38 = vmaxps_avx(auVar88._0_16_,auVar43);
        auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + local_12e8),auVar42,
                                  *(undefined1 (*) [16])(uVar11 + 0x20 + local_12e8));
        auVar43 = vsubps_avx(auVar43,auVar96._0_16_);
        auVar59._0_4_ = fVar109 * auVar43._0_4_;
        auVar59._4_4_ = fVar110 * auVar43._4_4_;
        auVar59._8_4_ = fVar111 * auVar43._8_4_;
        auVar59._12_4_ = fVar112 * auVar43._12_4_;
        auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + local_12f0),auVar42,
                                  *(undefined1 (*) [16])(uVar11 + 0x20 + local_12f0));
        auVar43 = vsubps_avx(auVar43,auVar103._0_16_);
        auVar65._0_4_ = fVar113 * auVar43._0_4_;
        auVar65._4_4_ = fVar126 * auVar43._4_4_;
        auVar65._8_4_ = fVar129 * auVar43._8_4_;
        auVar65._12_4_ = fVar115 * auVar43._12_4_;
        auVar43 = vmaxps_avx(auVar59,auVar65);
        auVar38 = vmaxps_avx(auVar38,auVar43);
        auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar30),auVar42,
                                  *(undefined1 (*) [16])(uVar11 + 0x20 + uVar30));
        auVar43 = vsubps_avx(auVar43,auVar95._0_16_);
        auVar60._0_4_ = fVar131 * auVar43._0_4_;
        auVar60._4_4_ = fVar133 * auVar43._4_4_;
        auVar60._8_4_ = fVar118 * auVar43._8_4_;
        auVar60._12_4_ = fVar119 * auVar43._12_4_;
        auVar43 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar31),auVar42,
                                  *(undefined1 (*) [16])(uVar11 + 0x20 + uVar31));
        auVar43 = vsubps_avx(auVar43,auVar96._0_16_);
        auVar59 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar11 + 0x80 + uVar29),auVar42,
                                  *(undefined1 (*) [16])(uVar11 + 0x20 + uVar29));
        auVar66._0_4_ = fVar120 * auVar43._0_4_;
        auVar66._4_4_ = fVar123 * auVar43._4_4_;
        auVar66._8_4_ = fVar124 * auVar43._8_4_;
        auVar66._12_4_ = fVar125 * auVar43._12_4_;
        auVar43 = vsubps_avx(auVar59,auVar103._0_16_);
        auVar74._0_4_ = fVar127 * auVar43._0_4_;
        auVar74._4_4_ = fVar130 * auVar43._4_4_;
        auVar74._8_4_ = fVar132 * auVar43._8_4_;
        auVar74._12_4_ = fVar134 * auVar43._12_4_;
        auVar43 = vminps_avx(auVar66,auVar74);
        auVar59 = vminps_avx(auVar41._0_16_,auVar60);
        auVar43 = vminps_avx(auVar59,auVar43);
        if (((uint)uVar15 & 7) == 6) {
          auVar59 = vcmpps_avx(auVar38,auVar43,2);
          auVar43 = vcmpps_avx(*(undefined1 (*) [16])(uVar11 + 0xe0),auVar42,2);
          auVar42 = vcmpps_avx(auVar42,*(undefined1 (*) [16])(uVar11 + 0xf0),1);
          auVar43 = vandps_avx(auVar43,auVar42);
          auVar43 = vandps_avx(auVar43,auVar59);
        }
        else {
          auVar43 = vcmpps_avx(auVar38,auVar43,2);
        }
        auVar43 = vpslld_avx(auVar43,0x1f);
        uVar13 = vmovmskps_avx(auVar43);
        local_10c0._0_16_ = auVar38;
        if (uVar13 == 0) {
          if (pauVar9 == (undefined1 (*) [16])&local_fa0) {
            return;
          }
          goto LAB_0056b18f;
        }
        uVar13 = uVar13 & 0xff;
        lVar21 = 0;
        for (uVar15 = (ulong)uVar13; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
          lVar21 = lVar21 + 1;
        }
        uVar15 = *(ulong *)(uVar11 + lVar21 * 8);
        uVar13 = uVar13 - 1 & uVar13;
        uVar14 = (ulong)uVar13;
        if (uVar13 != 0) {
          uVar3 = *(uint *)(local_10c0 + lVar21 * 4);
          lVar21 = 0;
          for (; (uVar14 & 1) == 0; uVar14 = uVar14 >> 1 | 0x8000000000000000) {
            lVar21 = lVar21 + 1;
          }
          uVar13 = uVar13 - 1 & uVar13;
          uVar17 = (ulong)uVar13;
          uVar14 = *(ulong *)(uVar11 + lVar21 * 8);
          uVar4 = *(uint *)(local_10c0 + lVar21 * 4);
          uVar22 = local_13e8;
          if (uVar13 == 0) {
            if (uVar3 < uVar4) {
              *(ulong *)*pauVar9 = uVar14;
              *(uint *)(*pauVar9 + 8) = uVar4;
              pauVar9 = pauVar9 + 1;
            }
            else {
              *(ulong *)*pauVar9 = uVar15;
              *(uint *)(*pauVar9 + 8) = uVar3;
              pauVar9 = pauVar9 + 1;
              uVar15 = uVar14;
            }
          }
          else {
            auVar38._8_8_ = 0;
            auVar38._0_8_ = uVar15;
            auVar38 = vpunpcklqdq_avx(auVar38,ZEXT416(uVar3));
            auVar53._8_8_ = 0;
            auVar53._0_8_ = uVar14;
            auVar43 = vpunpcklqdq_avx(auVar53,ZEXT416(uVar4));
            lVar21 = 0;
            for (; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
              lVar21 = lVar21 + 1;
            }
            uVar13 = uVar13 - 1 & uVar13;
            uVar15 = (ulong)uVar13;
            auVar61._8_8_ = 0;
            auVar61._0_8_ = *(ulong *)(uVar11 + lVar21 * 8);
            auVar42 = vpunpcklqdq_avx(auVar61,ZEXT416(*(uint *)(local_10c0 + lVar21 * 4)));
            auVar59 = vpcmpgtd_avx(auVar43,auVar38);
            if (uVar13 == 0) {
              auVar60 = vpshufd_avx(auVar59,0xaa);
              auVar59 = vblendvps_avx(auVar43,auVar38,auVar60);
              auVar38 = vblendvps_avx(auVar38,auVar43,auVar60);
              auVar43 = vpcmpgtd_avx(auVar42,auVar59);
              auVar60 = vpshufd_avx(auVar43,0xaa);
              auVar43 = vblendvps_avx(auVar42,auVar59,auVar60);
              auVar59 = vblendvps_avx(auVar59,auVar42,auVar60);
              auVar42 = vpcmpgtd_avx(auVar59,auVar38);
              auVar60 = vpshufd_avx(auVar42,0xaa);
              auVar42 = vblendvps_avx(auVar59,auVar38,auVar60);
              auVar38 = vblendvps_avx(auVar38,auVar59,auVar60);
              *pauVar9 = auVar38;
              pauVar9[1] = auVar42;
              uVar15 = auVar43._0_8_;
              pauVar9 = pauVar9 + 2;
            }
            else {
              lVar21 = 0;
              for (; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
                lVar21 = lVar21 + 1;
              }
              auVar75._8_8_ = 0;
              auVar75._0_8_ = *(ulong *)(uVar11 + lVar21 * 8);
              auVar65 = vpunpcklqdq_avx(auVar75,ZEXT416(*(uint *)(local_10c0 + lVar21 * 4)));
              auVar60 = vpshufd_avx(auVar59,0xaa);
              auVar59 = vblendvps_avx(auVar43,auVar38,auVar60);
              auVar38 = vblendvps_avx(auVar38,auVar43,auVar60);
              auVar43 = vpcmpgtd_avx(auVar65,auVar42);
              auVar60 = vpshufd_avx(auVar43,0xaa);
              auVar43 = vblendvps_avx(auVar65,auVar42,auVar60);
              auVar42 = vblendvps_avx(auVar42,auVar65,auVar60);
              auVar60 = vpcmpgtd_avx(auVar42,auVar38);
              auVar65 = vpshufd_avx(auVar60,0xaa);
              auVar60 = vblendvps_avx(auVar42,auVar38,auVar65);
              auVar38 = vblendvps_avx(auVar38,auVar42,auVar65);
              auVar42 = vpcmpgtd_avx(auVar43,auVar59);
              auVar65 = vpshufd_avx(auVar42,0xaa);
              auVar42 = vblendvps_avx(auVar43,auVar59,auVar65);
              auVar43 = vblendvps_avx(auVar59,auVar43,auVar65);
              auVar59 = vpcmpgtd_avx(auVar60,auVar43);
              auVar65 = vpshufd_avx(auVar59,0xaa);
              auVar59 = vblendvps_avx(auVar60,auVar43,auVar65);
              auVar43 = vblendvps_avx(auVar43,auVar60,auVar65);
              *pauVar9 = auVar38;
              pauVar9[1] = auVar43;
              pauVar9[2] = auVar59;
              auVar88 = ZEXT1664(local_12b0);
              uVar15 = auVar42._0_8_;
              pauVar9 = pauVar9 + 3;
            }
          }
        }
      }
      local_1300 = (ulong)((uint)uVar15 & 0xf) - 8;
      if (local_1300 != 0) {
        uVar15 = uVar15 & 0xfffffffffffffff0;
        local_12f8 = 0;
        do {
          lVar27 = local_12f8 * 0x50;
          pSVar16 = context->scene;
          pGVar25 = (pSVar16->geometries).items[*(uint *)(uVar15 + 0x30 + lVar27)].ptr;
          fVar119 = (pGVar25->time_range).lower;
          fVar119 = pGVar25->fnumTimeSegments *
                    ((*(float *)(ray + k * 4 + 0xe0) - fVar119) /
                    ((pGVar25->time_range).upper - fVar119));
          auVar38 = vroundss_avx(ZEXT416((uint)fVar119),ZEXT416((uint)fVar119),9);
          auVar38 = vminss_avx(auVar38,ZEXT416((uint)(pGVar25->fnumTimeSegments + -1.0)));
          auVar32 = vmaxss_avx(ZEXT816(0),auVar38);
          lVar12 = (long)(int)auVar32._0_4_ * 0x38;
          uVar14 = (ulong)*(uint *)(uVar15 + 4 + lVar27);
          lVar21 = *(long *)(*(long *)&pGVar25[2].numPrimitives + lVar12);
          lVar12 = *(long *)(*(long *)&pGVar25[2].numPrimitives + 0x38 + lVar12);
          auVar38 = *(undefined1 (*) [16])(lVar21 + (ulong)*(uint *)(uVar15 + lVar27) * 4);
          uVar26 = (ulong)*(uint *)(uVar15 + 0x10 + lVar27);
          auVar43 = *(undefined1 (*) [16])(lVar21 + uVar26 * 4);
          uVar17 = (ulong)*(uint *)(uVar15 + 0x20 + lVar27);
          auVar45 = *(undefined1 (*) [16])(lVar21 + uVar17 * 4);
          auVar59 = *(undefined1 (*) [16])(lVar21 + uVar14 * 4);
          uVar18 = (ulong)*(uint *)(uVar15 + 0x14 + lVar27);
          auVar42 = *(undefined1 (*) [16])(lVar21 + uVar18 * 4);
          uVar19 = (ulong)*(uint *)(uVar15 + 0x24 + lVar27);
          auVar46 = *(undefined1 (*) [16])(lVar21 + uVar19 * 4);
          uVar20 = (ulong)*(uint *)(uVar15 + 8 + lVar27);
          auVar60 = *(undefined1 (*) [16])(lVar21 + uVar20 * 4);
          uVar22 = (ulong)*(uint *)(uVar15 + 0x18 + lVar27);
          auVar65 = *(undefined1 (*) [16])(lVar21 + uVar22 * 4);
          uVar23 = (ulong)*(uint *)(uVar15 + 0x28 + lVar27);
          auVar66 = *(undefined1 (*) [16])(lVar21 + uVar23 * 4);
          uVar24 = (ulong)*(uint *)(uVar15 + 0xc + lVar27);
          auVar74 = *(undefined1 (*) [16])(lVar21 + uVar24 * 4);
          uVar28 = (ulong)*(uint *)(uVar15 + 0x1c + lVar27);
          auVar53 = *(undefined1 (*) [16])(lVar21 + uVar28 * 4);
          uVar11 = (ulong)*(uint *)(uVar15 + 0x2c + lVar27);
          auVar61 = *(undefined1 (*) [16])(lVar21 + uVar11 * 4);
          auVar75 = *(undefined1 (*) [16])(lVar12 + (ulong)*(uint *)(uVar15 + lVar27) * 4);
          auVar33 = *(undefined1 (*) [16])(lVar12 + uVar26 * 4);
          fVar119 = fVar119 - auVar32._0_4_;
          auVar32 = vunpcklps_avx(auVar38,auVar60);
          auVar60 = vunpckhps_avx(auVar38,auVar60);
          auVar34 = vunpcklps_avx(auVar59,auVar74);
          auVar59 = vunpckhps_avx(auVar59,auVar74);
          auVar38 = *(undefined1 (*) [16])(lVar12 + uVar14 * 4);
          auVar35 = vunpcklps_avx(auVar60,auVar59);
          auVar44 = vunpcklps_avx(auVar32,auVar34);
          auVar60 = vunpckhps_avx(auVar32,auVar34);
          auVar74 = vunpcklps_avx(auVar43,auVar65);
          auVar59 = vunpckhps_avx(auVar43,auVar65);
          auVar65 = vunpcklps_avx(auVar42,auVar53);
          auVar42 = vunpckhps_avx(auVar42,auVar53);
          auVar43 = *(undefined1 (*) [16])(lVar12 + uVar20 * 4);
          auVar53 = vunpcklps_avx(auVar59,auVar42);
          auVar32 = vunpcklps_avx(auVar74,auVar65);
          auVar42 = vunpckhps_avx(auVar74,auVar65);
          auVar74 = vunpcklps_avx(auVar45,auVar66);
          auVar65 = vunpckhps_avx(auVar45,auVar66);
          auVar34 = vunpcklps_avx(auVar46,auVar61);
          auVar66 = vunpckhps_avx(auVar46,auVar61);
          auVar59 = *(undefined1 (*) [16])(lVar12 + uVar24 * 4);
          auVar61 = vunpcklps_avx(auVar65,auVar66);
          auVar45 = vunpcklps_avx(auVar74,auVar34);
          auVar65 = vunpckhps_avx(auVar74,auVar34);
          auVar66 = vunpcklps_avx(auVar75,auVar43);
          auVar43 = vunpckhps_avx(auVar75,auVar43);
          auVar74 = vunpcklps_avx(auVar38,auVar59);
          auVar59 = vunpckhps_avx(auVar38,auVar59);
          auVar38 = *(undefined1 (*) [16])(lVar12 + uVar22 * 4);
          auVar75 = vunpcklps_avx(auVar43,auVar59);
          auVar34 = vunpcklps_avx(auVar66,auVar74);
          auVar59 = vunpckhps_avx(auVar66,auVar74);
          auVar74 = vunpcklps_avx(auVar33,auVar38);
          auVar66 = vunpckhps_avx(auVar33,auVar38);
          auVar38 = *(undefined1 (*) [16])(lVar12 + uVar18 * 4);
          auVar43 = *(undefined1 (*) [16])(lVar12 + uVar28 * 4);
          auVar33 = vunpcklps_avx(auVar38,auVar43);
          auVar38 = vunpckhps_avx(auVar38,auVar43);
          auVar46 = vunpcklps_avx(auVar66,auVar38);
          auVar54 = vunpcklps_avx(auVar74,auVar33);
          auVar66 = vunpckhps_avx(auVar74,auVar33);
          auVar38 = *(undefined1 (*) [16])(lVar12 + uVar17 * 4);
          auVar43 = *(undefined1 (*) [16])(lVar12 + uVar23 * 4);
          auVar33 = vunpcklps_avx(auVar38,auVar43);
          auVar74 = vunpckhps_avx(auVar38,auVar43);
          auVar38 = *(undefined1 (*) [16])(lVar12 + uVar19 * 4);
          auVar43 = *(undefined1 (*) [16])(lVar12 + uVar11 * 4);
          auVar55 = vunpcklps_avx(auVar38,auVar43);
          auVar38 = vunpckhps_avx(auVar38,auVar43);
          auVar43 = vunpcklps_avx(auVar74,auVar38);
          auVar74 = vunpcklps_avx(auVar33,auVar55);
          auVar38 = vunpckhps_avx(auVar33,auVar55);
          fVar125 = 1.0 - fVar119;
          auVar114._4_4_ = fVar125;
          auVar114._0_4_ = fVar125;
          auVar114._8_4_ = fVar125;
          auVar114._12_4_ = fVar125;
          auVar80._0_4_ = fVar119 * auVar34._0_4_;
          auVar80._4_4_ = fVar119 * auVar34._4_4_;
          auVar80._8_4_ = fVar119 * auVar34._8_4_;
          auVar80._12_4_ = fVar119 * auVar34._12_4_;
          auVar33 = vfmadd231ps_fma(auVar80,auVar114,auVar44);
          auVar97._0_4_ = fVar119 * auVar59._0_4_;
          auVar97._4_4_ = fVar119 * auVar59._4_4_;
          auVar97._8_4_ = fVar119 * auVar59._8_4_;
          auVar97._12_4_ = fVar119 * auVar59._12_4_;
          auVar59 = vfmadd231ps_fma(auVar97,auVar114,auVar60);
          auVar89._0_4_ = fVar119 * auVar75._0_4_;
          auVar89._4_4_ = fVar119 * auVar75._4_4_;
          auVar89._8_4_ = fVar119 * auVar75._8_4_;
          auVar89._12_4_ = fVar119 * auVar75._12_4_;
          auVar60 = vfmadd231ps_fma(auVar89,auVar114,auVar35);
          auVar76._0_4_ = fVar119 * auVar54._0_4_;
          auVar76._4_4_ = fVar119 * auVar54._4_4_;
          auVar76._8_4_ = fVar119 * auVar54._8_4_;
          auVar76._12_4_ = fVar119 * auVar54._12_4_;
          auVar75 = vfmadd231ps_fma(auVar76,auVar114,auVar32);
          auVar67._0_4_ = fVar119 * auVar66._0_4_;
          auVar67._4_4_ = fVar119 * auVar66._4_4_;
          auVar67._8_4_ = fVar119 * auVar66._8_4_;
          auVar67._12_4_ = fVar119 * auVar66._12_4_;
          auVar42 = vfmadd231ps_fma(auVar67,auVar114,auVar42);
          puVar1 = (undefined8 *)(uVar15 + 0x30 + lVar27);
          local_10f0 = *puVar1;
          uStack_10e8 = puVar1[1];
          puVar1 = (undefined8 *)(uVar15 + 0x40 + lVar27);
          auVar44._0_4_ = fVar119 * auVar46._0_4_;
          auVar44._4_4_ = fVar119 * auVar46._4_4_;
          auVar44._8_4_ = fVar119 * auVar46._8_4_;
          auVar44._12_4_ = fVar119 * auVar46._12_4_;
          auVar66 = vfmadd231ps_fma(auVar44,auVar114,auVar53);
          auVar54._0_4_ = fVar119 * auVar74._0_4_;
          auVar54._4_4_ = fVar119 * auVar74._4_4_;
          auVar54._8_4_ = fVar119 * auVar74._8_4_;
          auVar54._12_4_ = fVar119 * auVar74._12_4_;
          auVar62._0_4_ = fVar119 * auVar38._0_4_;
          auVar62._4_4_ = fVar119 * auVar38._4_4_;
          auVar62._8_4_ = fVar119 * auVar38._8_4_;
          auVar62._12_4_ = fVar119 * auVar38._12_4_;
          auVar105._0_4_ = fVar119 * auVar43._0_4_;
          auVar105._4_4_ = fVar119 * auVar43._4_4_;
          auVar105._8_4_ = fVar119 * auVar43._8_4_;
          auVar105._12_4_ = fVar119 * auVar43._12_4_;
          auVar74 = vfmadd231ps_fma(auVar54,auVar114,auVar45);
          auVar65 = vfmadd231ps_fma(auVar62,auVar114,auVar65);
          auVar53 = vfmadd231ps_fma(auVar105,auVar114,auVar61);
          local_12a0 = *puVar1;
          uStack_1298 = puVar1[1];
          uVar8 = *(undefined4 *)(local_13a0 + local_13a8 * 4);
          auVar32._4_4_ = uVar8;
          auVar32._0_4_ = uVar8;
          auVar32._8_4_ = uVar8;
          auVar32._12_4_ = uVar8;
          uVar8 = *(undefined4 *)(local_13a0 + local_13a8 * 4 + 0x20);
          auVar116._4_4_ = uVar8;
          auVar116._0_4_ = uVar8;
          auVar116._8_4_ = uVar8;
          auVar116._12_4_ = uVar8;
          uVar8 = *(undefined4 *)(local_13a0 + local_13a8 * 4 + 0x40);
          auVar121._4_4_ = uVar8;
          auVar121._0_4_ = uVar8;
          auVar121._8_4_ = uVar8;
          auVar121._12_4_ = uVar8;
          local_1360 = vsubps_avx(auVar33,auVar32);
          local_1370 = vsubps_avx(auVar59,auVar116);
          local_1380 = vsubps_avx(auVar60,auVar121);
          auVar38 = vsubps_avx(auVar75,auVar32);
          auVar43 = vsubps_avx(auVar42,auVar116);
          auVar59 = vsubps_avx(auVar66,auVar121);
          auVar42 = vsubps_avx(auVar74,auVar32);
          auVar60 = vsubps_avx(auVar65,auVar116);
          auVar65 = vsubps_avx(auVar53,auVar121);
          local_1390 = vsubps_avx(auVar42,local_1360);
          local_1320 = vsubps_avx(auVar60,local_1370);
          local_1310 = vsubps_avx(auVar65,local_1380);
          auVar33._0_4_ = auVar42._0_4_ + local_1360._0_4_;
          auVar33._4_4_ = auVar42._4_4_ + local_1360._4_4_;
          auVar33._8_4_ = auVar42._8_4_ + local_1360._8_4_;
          auVar33._12_4_ = auVar42._12_4_ + local_1360._12_4_;
          auVar63._0_4_ = auVar60._0_4_ + local_1370._0_4_;
          auVar63._4_4_ = auVar60._4_4_ + local_1370._4_4_;
          auVar63._8_4_ = auVar60._8_4_ + local_1370._8_4_;
          auVar63._12_4_ = auVar60._12_4_ + local_1370._12_4_;
          fVar125 = local_1380._0_4_;
          auVar68._0_4_ = auVar65._0_4_ + fVar125;
          fVar134 = local_1380._4_4_;
          auVar68._4_4_ = auVar65._4_4_ + fVar134;
          fVar108 = local_1380._8_4_;
          auVar68._8_4_ = auVar65._8_4_ + fVar108;
          fVar112 = local_1380._12_4_;
          auVar68._12_4_ = auVar65._12_4_ + fVar112;
          auVar117._0_4_ = local_1310._0_4_ * auVar63._0_4_;
          auVar117._4_4_ = local_1310._4_4_ * auVar63._4_4_;
          auVar117._8_4_ = local_1310._8_4_ * auVar63._8_4_;
          auVar117._12_4_ = local_1310._12_4_ * auVar63._12_4_;
          auVar74 = vfmsub231ps_fma(auVar117,local_1320,auVar68);
          auVar69._0_4_ = local_1390._0_4_ * auVar68._0_4_;
          auVar69._4_4_ = local_1390._4_4_ * auVar68._4_4_;
          auVar69._8_4_ = local_1390._8_4_ * auVar68._8_4_;
          auVar69._12_4_ = local_1390._12_4_ * auVar68._12_4_;
          auVar66 = vfmsub231ps_fma(auVar69,local_1310,auVar33);
          auVar34._0_4_ = local_1320._0_4_ * auVar33._0_4_;
          auVar34._4_4_ = local_1320._4_4_ * auVar33._4_4_;
          auVar34._8_4_ = local_1320._8_4_ * auVar33._8_4_;
          auVar34._12_4_ = local_1320._12_4_ * auVar33._12_4_;
          auVar53 = vfmsub231ps_fma(auVar34,local_1390,auVar63);
          fVar119 = *(float *)(local_13a0 + local_13a8 * 4 + 0xc0);
          auVar55._0_4_ = fVar119 * auVar53._0_4_;
          auVar55._4_4_ = fVar119 * auVar53._4_4_;
          auVar55._8_4_ = fVar119 * auVar53._8_4_;
          auVar55._12_4_ = fVar119 * auVar53._12_4_;
          uVar8 = *(undefined4 *)(local_13a0 + local_13a8 * 4 + 0xa0);
          auVar98._4_4_ = uVar8;
          auVar98._0_4_ = uVar8;
          auVar98._8_4_ = uVar8;
          auVar98._12_4_ = uVar8;
          auVar66 = vfmadd231ps_fma(auVar55,auVar98,auVar66);
          uVar8 = *(undefined4 *)(local_13a0 + local_13a8 * 4 + 0x80);
          auVar122._4_4_ = uVar8;
          auVar122._0_4_ = uVar8;
          auVar122._8_4_ = uVar8;
          auVar122._12_4_ = uVar8;
          local_1110 = vfmadd231ps_fma(auVar66,auVar122,auVar74);
          local_1330 = vsubps_avx(local_1370,auVar43);
          local_1100 = vsubps_avx(local_1380,auVar59);
          auVar64._0_4_ = local_1370._0_4_ + auVar43._0_4_;
          auVar64._4_4_ = local_1370._4_4_ + auVar43._4_4_;
          auVar64._8_4_ = local_1370._8_4_ + auVar43._8_4_;
          auVar64._12_4_ = local_1370._12_4_ + auVar43._12_4_;
          auVar70._0_4_ = auVar59._0_4_ + fVar125;
          auVar70._4_4_ = auVar59._4_4_ + fVar134;
          auVar70._8_4_ = auVar59._8_4_ + fVar108;
          auVar70._12_4_ = auVar59._12_4_ + fVar112;
          fVar115 = local_1100._0_4_;
          auVar81._0_4_ = auVar64._0_4_ * fVar115;
          fVar106 = local_1100._4_4_;
          auVar81._4_4_ = auVar64._4_4_ * fVar106;
          fVar109 = local_1100._8_4_;
          auVar81._8_4_ = auVar64._8_4_ * fVar109;
          fVar111 = local_1100._12_4_;
          auVar81._12_4_ = auVar64._12_4_ * fVar111;
          auVar74 = vfmsub231ps_fma(auVar81,local_1330,auVar70);
          local_1340 = vsubps_avx(local_1360,auVar38);
          fVar126 = local_1340._0_4_;
          auVar90._0_4_ = fVar126 * auVar70._0_4_;
          fVar129 = local_1340._4_4_;
          auVar90._4_4_ = fVar129 * auVar70._4_4_;
          fVar131 = local_1340._8_4_;
          auVar90._8_4_ = fVar131 * auVar70._8_4_;
          fVar133 = local_1340._12_4_;
          auVar90._12_4_ = fVar133 * auVar70._12_4_;
          auVar71._0_4_ = local_1360._0_4_ + auVar38._0_4_;
          auVar71._4_4_ = local_1360._4_4_ + auVar38._4_4_;
          auVar71._8_4_ = local_1360._8_4_ + auVar38._8_4_;
          auVar71._12_4_ = local_1360._12_4_ + auVar38._12_4_;
          auVar66 = vfmsub231ps_fma(auVar90,local_1100,auVar71);
          fVar104 = local_1330._0_4_;
          auVar72._0_4_ = auVar71._0_4_ * fVar104;
          fVar107 = local_1330._4_4_;
          auVar72._4_4_ = auVar71._4_4_ * fVar107;
          fVar110 = local_1330._8_4_;
          auVar72._8_4_ = auVar71._8_4_ * fVar110;
          fVar113 = local_1330._12_4_;
          auVar72._12_4_ = auVar71._12_4_ * fVar113;
          auVar53 = vfmsub231ps_fma(auVar72,local_1340,auVar64);
          auVar73._0_4_ = fVar119 * auVar53._0_4_;
          auVar73._4_4_ = fVar119 * auVar53._4_4_;
          auVar73._8_4_ = fVar119 * auVar53._8_4_;
          auVar73._12_4_ = fVar119 * auVar53._12_4_;
          auVar66 = vfmadd231ps_fma(auVar73,auVar98,auVar66);
          local_1280 = vfmadd231ps_fma(auVar66,auVar122,auVar74);
          auVar66 = vsubps_avx(auVar38,auVar42);
          auVar82._0_4_ = auVar42._0_4_ + auVar38._0_4_;
          auVar82._4_4_ = auVar42._4_4_ + auVar38._4_4_;
          auVar82._8_4_ = auVar42._8_4_ + auVar38._8_4_;
          auVar82._12_4_ = auVar42._12_4_ + auVar38._12_4_;
          auVar42 = vsubps_avx(auVar43,auVar60);
          auVar35._0_4_ = auVar43._0_4_ + auVar60._0_4_;
          auVar35._4_4_ = auVar43._4_4_ + auVar60._4_4_;
          auVar35._8_4_ = auVar43._8_4_ + auVar60._8_4_;
          auVar35._12_4_ = auVar43._12_4_ + auVar60._12_4_;
          auVar60 = vsubps_avx(auVar59,auVar65);
          auVar45._0_4_ = auVar59._0_4_ + auVar65._0_4_;
          auVar45._4_4_ = auVar59._4_4_ + auVar65._4_4_;
          auVar45._8_4_ = auVar59._8_4_ + auVar65._8_4_;
          auVar45._12_4_ = auVar59._12_4_ + auVar65._12_4_;
          auVar91._0_4_ = auVar35._0_4_ * auVar60._0_4_;
          auVar91._4_4_ = auVar35._4_4_ * auVar60._4_4_;
          auVar91._8_4_ = auVar35._8_4_ * auVar60._8_4_;
          auVar91._12_4_ = auVar35._12_4_ * auVar60._12_4_;
          auVar43 = vfmsub231ps_fma(auVar91,auVar42,auVar45);
          auVar46._0_4_ = auVar45._0_4_ * auVar66._0_4_;
          auVar46._4_4_ = auVar45._4_4_ * auVar66._4_4_;
          auVar46._8_4_ = auVar45._8_4_ * auVar66._8_4_;
          auVar46._12_4_ = auVar45._12_4_ * auVar66._12_4_;
          auVar38 = vfmsub231ps_fma(auVar46,auVar60,auVar82);
          auVar83._0_4_ = auVar42._0_4_ * auVar82._0_4_;
          auVar83._4_4_ = auVar42._4_4_ * auVar82._4_4_;
          auVar83._8_4_ = auVar42._8_4_ * auVar82._8_4_;
          auVar83._12_4_ = auVar42._12_4_ * auVar82._12_4_;
          auVar59 = vfmsub231ps_fma(auVar83,auVar66,auVar35);
          auVar84._0_4_ = fVar119 * auVar59._0_4_;
          auVar84._4_4_ = fVar119 * auVar59._4_4_;
          auVar84._8_4_ = fVar119 * auVar59._8_4_;
          auVar84._12_4_ = fVar119 * auVar59._12_4_;
          auVar38 = vfmadd231ps_fma(auVar84,auVar98,auVar38);
          auVar59 = vfmadd231ps_fma(auVar38,auVar122,auVar43);
          local_1290 = local_1110._0_4_;
          fStack_128c = local_1110._4_4_;
          fStack_1288 = local_1110._8_4_;
          fStack_1284 = local_1110._12_4_;
          local_1270._0_4_ = auVar59._0_4_ + local_1290 + local_1280._0_4_;
          local_1270._4_4_ = auVar59._4_4_ + fStack_128c + local_1280._4_4_;
          local_1270._8_4_ = auVar59._8_4_ + fStack_1288 + local_1280._8_4_;
          local_1270._12_4_ = auVar59._12_4_ + fStack_1284 + local_1280._12_4_;
          auVar128._8_4_ = 0x7fffffff;
          auVar128._0_8_ = 0x7fffffff7fffffff;
          auVar128._12_4_ = 0x7fffffff;
          auVar38 = vminps_avx(local_1110,local_1280);
          auVar38 = vminps_avx(auVar38,auVar59);
          local_1120 = vandps_avx(local_1270,auVar128);
          auVar99._0_4_ = local_1120._0_4_ * 1.1920929e-07;
          auVar99._4_4_ = local_1120._4_4_ * 1.1920929e-07;
          auVar99._8_4_ = local_1120._8_4_ * 1.1920929e-07;
          auVar99._12_4_ = local_1120._12_4_ * 1.1920929e-07;
          uVar22 = CONCAT44(auVar99._4_4_,auVar99._0_4_);
          auVar92._0_8_ = uVar22 ^ 0x8000000080000000;
          auVar92._8_4_ = -auVar99._8_4_;
          auVar92._12_4_ = -auVar99._12_4_;
          auVar38 = vcmpps_avx(auVar38,auVar92,5);
          auVar43 = vmaxps_avx(local_1110,local_1280);
          auVar43 = vmaxps_avx(auVar43,auVar59);
          auVar43 = vcmpps_avx(auVar43,auVar99,2);
          local_13e0 = vorps_avx(auVar38,auVar43);
          ray = local_13a0;
          k = local_13a8;
          if ((((local_13e0 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (local_13e0 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (local_13e0 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              local_13e0[0xf] < '\0') {
            auVar47._0_4_ = fVar104 * local_1310._0_4_;
            auVar47._4_4_ = fVar107 * local_1310._4_4_;
            auVar47._8_4_ = fVar110 * local_1310._8_4_;
            auVar47._12_4_ = fVar113 * local_1310._12_4_;
            auVar85._0_4_ = fVar126 * local_1320._0_4_;
            auVar85._4_4_ = fVar129 * local_1320._4_4_;
            auVar85._8_4_ = fVar131 * local_1320._8_4_;
            auVar85._12_4_ = fVar133 * local_1320._12_4_;
            auVar59 = vfmsub213ps_fma(local_1320,local_1100,auVar47);
            auVar93._0_4_ = auVar42._0_4_ * fVar115;
            auVar93._4_4_ = auVar42._4_4_ * fVar106;
            auVar93._8_4_ = auVar42._8_4_ * fVar109;
            auVar93._12_4_ = auVar42._12_4_ * fVar111;
            auVar100._0_4_ = fVar126 * auVar60._0_4_;
            auVar100._4_4_ = fVar129 * auVar60._4_4_;
            auVar100._8_4_ = fVar131 * auVar60._8_4_;
            auVar100._12_4_ = fVar133 * auVar60._12_4_;
            auVar60 = vfmsub213ps_fma(auVar60,local_1330,auVar93);
            auVar38 = vandps_avx(auVar128,auVar47);
            auVar43 = vandps_avx(auVar128,auVar93);
            auVar38 = vcmpps_avx(auVar38,auVar43,1);
            local_1210 = vblendvps_avx(auVar60,auVar59,auVar38);
            auVar77._0_4_ = fVar104 * auVar66._0_4_;
            auVar77._4_4_ = fVar107 * auVar66._4_4_;
            auVar77._8_4_ = fVar110 * auVar66._8_4_;
            auVar77._12_4_ = fVar113 * auVar66._12_4_;
            auVar59 = vfmsub213ps_fma(auVar66,local_1100,auVar100);
            auVar94._0_4_ = local_1390._0_4_ * fVar115;
            auVar94._4_4_ = local_1390._4_4_ * fVar106;
            auVar94._8_4_ = local_1390._8_4_ * fVar109;
            auVar94._12_4_ = local_1390._12_4_ * fVar111;
            auVar60 = vfmsub213ps_fma(local_1310,local_1340,auVar94);
            auVar38 = vandps_avx(auVar128,auVar94);
            auVar43 = vandps_avx(auVar100,auVar128);
            auVar38 = vcmpps_avx(auVar38,auVar43,1);
            local_1200 = vblendvps_avx(auVar59,auVar60,auVar38);
            auVar59 = vfmsub213ps_fma(local_1390,local_1330,auVar85);
            auVar42 = vfmsub213ps_fma(auVar42,local_1340,auVar77);
            auVar38 = vandps_avx(auVar128,auVar85);
            auVar43 = vandps_avx(auVar128,auVar77);
            auVar38 = vcmpps_avx(auVar38,auVar43,1);
            local_11f0 = vblendvps_avx(auVar42,auVar59,auVar38);
            auVar78._0_4_ = local_11f0._0_4_ * fVar119;
            auVar78._4_4_ = local_11f0._4_4_ * fVar119;
            auVar78._8_4_ = local_11f0._8_4_ * fVar119;
            auVar78._12_4_ = local_11f0._12_4_ * fVar119;
            auVar38 = vfmadd213ps_fma(auVar98,local_1200,auVar78);
            auVar38 = vfmadd213ps_fma(auVar122,local_1210,auVar38);
            auVar79._0_4_ = auVar38._0_4_ + auVar38._0_4_;
            auVar79._4_4_ = auVar38._4_4_ + auVar38._4_4_;
            auVar79._8_4_ = auVar38._8_4_ + auVar38._8_4_;
            auVar79._12_4_ = auVar38._12_4_ + auVar38._12_4_;
            auVar86._0_4_ = local_11f0._0_4_ * fVar125;
            auVar86._4_4_ = local_11f0._4_4_ * fVar134;
            auVar86._8_4_ = local_11f0._8_4_ * fVar108;
            auVar86._12_4_ = local_11f0._12_4_ * fVar112;
            auVar38 = vfmadd213ps_fma(local_1370,local_1200,auVar86);
            auVar43 = vfmadd213ps_fma(local_1360,local_1210,auVar38);
            auVar38 = vrcpps_avx(auVar79);
            auVar101._8_4_ = 0x3f800000;
            auVar101._0_8_ = 0x3f8000003f800000;
            auVar101._12_4_ = 0x3f800000;
            auVar59 = vfnmadd213ps_fma(auVar38,auVar79,auVar101);
            auVar38 = vfmadd132ps_fma(auVar59,auVar38,auVar38);
            local_1220._0_4_ = auVar38._0_4_ * (auVar43._0_4_ + auVar43._0_4_);
            local_1220._4_4_ = auVar38._4_4_ * (auVar43._4_4_ + auVar43._4_4_);
            local_1220._8_4_ = auVar38._8_4_ * (auVar43._8_4_ + auVar43._8_4_);
            local_1220._12_4_ = auVar38._12_4_ * (auVar43._12_4_ + auVar43._12_4_);
            auVar88 = ZEXT1664(local_1220);
            uVar8 = *(undefined4 *)(local_13a0 + local_13a8 * 4 + 0x60);
            auVar87._4_4_ = uVar8;
            auVar87._0_4_ = uVar8;
            auVar87._8_4_ = uVar8;
            auVar87._12_4_ = uVar8;
            auVar38 = vcmpps_avx(auVar87,local_1220,2);
            uVar8 = *(undefined4 *)(local_13a0 + local_13a8 * 4 + 0x100);
            auVar102._4_4_ = uVar8;
            auVar102._0_4_ = uVar8;
            auVar102._8_4_ = uVar8;
            auVar102._12_4_ = uVar8;
            auVar41 = ZEXT1664(auVar102);
            auVar43 = vcmpps_avx(local_1220,auVar102,2);
            auVar38 = vandps_avx(auVar38,auVar43);
            auVar43 = local_13e0 & auVar38;
            if ((((auVar43 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar43 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar43 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar43[0xf] < '\0') {
              auVar38 = vandps_avx(auVar38,local_13e0);
              auVar43 = vcmpps_avx(auVar79,_DAT_01f7aa10,4);
              auVar59 = auVar43 & auVar38;
              if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar59[0xf] < '\0') {
                local_1350 = vandps_avx(auVar38,auVar43);
                pRVar10 = &local_13e9;
                local_1260 = pRVar10;
                local_1250 = local_1350;
                auVar38 = vrcpps_avx(local_1270);
                auVar56._8_4_ = 0x3f800000;
                auVar56._0_8_ = 0x3f8000003f800000;
                auVar56._12_4_ = 0x3f800000;
                auVar43 = vfnmadd213ps_fma(local_1270,auVar38,auVar56);
                auVar43 = vfmadd132ps_fma(auVar43,auVar38,auVar38);
                auVar48._8_4_ = 0x219392ef;
                auVar48._0_8_ = 0x219392ef219392ef;
                auVar48._12_4_ = 0x219392ef;
                auVar38 = vcmpps_avx(local_1120,auVar48,5);
                auVar38 = vandps_avx(auVar43,auVar38);
                auVar36._0_4_ = local_1290 * auVar38._0_4_;
                auVar36._4_4_ = fStack_128c * auVar38._4_4_;
                auVar36._8_4_ = fStack_1288 * auVar38._8_4_;
                auVar36._12_4_ = fStack_1284 * auVar38._12_4_;
                local_1240 = vminps_avx(auVar36,auVar56);
                auVar37._0_4_ = auVar38._0_4_ * local_1280._0_4_;
                auVar37._4_4_ = auVar38._4_4_ * local_1280._4_4_;
                auVar37._8_4_ = auVar38._8_4_ * local_1280._8_4_;
                auVar37._12_4_ = auVar38._12_4_ * local_1280._12_4_;
                local_1230 = vminps_avx(auVar37,auVar56);
                auVar49._8_4_ = 0x7f800000;
                auVar49._0_8_ = 0x7f8000007f800000;
                auVar49._12_4_ = 0x7f800000;
                auVar38 = vblendvps_avx(auVar49,local_1220,local_1350);
                auVar43 = vshufps_avx(auVar38,auVar38,0xb1);
                auVar43 = vminps_avx(auVar43,auVar38);
                auVar59 = vshufpd_avx(auVar43,auVar43,1);
                auVar43 = vminps_avx(auVar59,auVar43);
                auVar38 = vcmpps_avx(auVar38,auVar43,0);
                auVar59 = local_1350 & auVar38;
                auVar43 = vpcmpeqd_avx(auVar43,auVar43);
                if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar59[0xf] < '\0') {
                  auVar43 = auVar38;
                }
                auVar38 = vandps_avx(local_1350,auVar43);
                local_1398 = pSVar16;
                do {
                  auVar38 = vpslld_avx(auVar38,0x1f);
                  uVar8 = vmovmskps_avx(auVar38);
                  lVar21 = 0;
                  for (uVar22 = CONCAT44((int)((ulong)pRVar10 >> 0x20),uVar8); (uVar22 & 1) == 0;
                      uVar22 = uVar22 >> 1 | 0x8000000000000000) {
                    lVar21 = lVar21 + 1;
                  }
                  uVar13 = *(uint *)((long)&local_10f0 + lVar21 * 4);
                  pRVar10 = (RayHitK<8> *)(ulong)uVar13;
                  pGVar25 = (pSVar16->geometries).items[(long)pRVar10].ptr;
                  if ((pGVar25->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                    *(undefined4 *)(local_1350 + lVar21 * 4) = 0;
                  }
                  else {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar25->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      uVar22 = (ulong)(uint)((int)lVar21 << 2);
                      uVar8 = *(undefined4 *)(local_1240 + uVar22);
                      uVar2 = *(undefined4 *)(local_1230 + uVar22);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1220 + uVar22);
                      *(undefined4 *)(ray + k * 4 + 0x180) = *(undefined4 *)(local_1210 + uVar22);
                      *(undefined4 *)(ray + k * 4 + 0x1a0) = *(undefined4 *)(local_1200 + uVar22);
                      *(undefined4 *)(ray + k * 4 + 0x1c0) = *(undefined4 *)(local_11f0 + uVar22);
                      *(undefined4 *)(ray + k * 4 + 0x1e0) = uVar8;
                      *(undefined4 *)(ray + k * 4 + 0x200) = uVar2;
                      *(undefined4 *)(ray + k * 4 + 0x220) =
                           *(undefined4 *)((long)&local_12a0 + uVar22);
                      *(uint *)(ray + k * 4 + 0x240) = uVar13;
                      *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                      break;
                    }
                    uVar22 = (ulong)(uint)((int)lVar21 * 4);
                    uVar8 = *(undefined4 *)(local_1240 + uVar22);
                    local_1060._4_4_ = uVar8;
                    local_1060._0_4_ = uVar8;
                    local_1060._8_4_ = uVar8;
                    local_1060._12_4_ = uVar8;
                    local_1060._16_4_ = uVar8;
                    local_1060._20_4_ = uVar8;
                    local_1060._24_4_ = uVar8;
                    local_1060._28_4_ = uVar8;
                    local_1040 = *(undefined4 *)(local_1230 + uVar22);
                    uVar8 = *(undefined4 *)((long)&local_12a0 + uVar22);
                    local_1020._4_4_ = uVar8;
                    local_1020._0_4_ = uVar8;
                    local_1020._8_4_ = uVar8;
                    local_1020._12_4_ = uVar8;
                    local_1020._16_4_ = uVar8;
                    local_1020._20_4_ = uVar8;
                    local_1020._24_4_ = uVar8;
                    local_1020._28_4_ = uVar8;
                    uVar8 = *(undefined4 *)(local_1210 + uVar22);
                    local_10c0._4_4_ = uVar8;
                    local_10c0._0_4_ = uVar8;
                    local_10c0._8_4_ = uVar8;
                    local_10c0._12_4_ = uVar8;
                    local_10c0._16_4_ = uVar8;
                    local_10c0._20_4_ = uVar8;
                    local_10c0._24_4_ = uVar8;
                    local_10c0._28_4_ = uVar8;
                    uVar8 = *(undefined4 *)(local_1200 + uVar22);
                    local_10a0._4_4_ = uVar8;
                    local_10a0._0_4_ = uVar8;
                    local_10a0._8_4_ = uVar8;
                    local_10a0._12_4_ = uVar8;
                    local_10a0._16_4_ = uVar8;
                    local_10a0._20_4_ = uVar8;
                    local_10a0._24_4_ = uVar8;
                    local_10a0._28_4_ = uVar8;
                    uVar8 = *(undefined4 *)(local_11f0 + uVar22);
                    local_1080._4_4_ = uVar8;
                    local_1080._0_4_ = uVar8;
                    local_1080._8_4_ = uVar8;
                    local_1080._12_4_ = uVar8;
                    local_1080._16_4_ = uVar8;
                    local_1080._20_4_ = uVar8;
                    local_1080._24_4_ = uVar8;
                    local_1080._28_4_ = uVar8;
                    auVar57._4_4_ = uVar13;
                    auVar57._0_4_ = uVar13;
                    auVar57._8_4_ = uVar13;
                    auVar57._12_4_ = uVar13;
                    auVar58._16_4_ = uVar13;
                    auVar58._0_16_ = auVar57;
                    auVar58._20_4_ = uVar13;
                    auVar58._24_4_ = uVar13;
                    auVar58._28_4_ = uVar13;
                    uStack_103c = local_1040;
                    uStack_1038 = local_1040;
                    uStack_1034 = local_1040;
                    uStack_1030 = local_1040;
                    uStack_102c = local_1040;
                    uStack_1028 = local_1040;
                    uStack_1024 = local_1040;
                    local_1000 = auVar58;
                    vpcmpeqd_avx2(local_1060,local_1060);
                    uStack_fdc = context->user->instID[0];
                    local_fe0 = uStack_fdc;
                    uStack_fd8 = uStack_fdc;
                    uStack_fd4 = uStack_fdc;
                    uStack_fd0 = uStack_fdc;
                    uStack_fcc = uStack_fdc;
                    uStack_fc8 = uStack_fdc;
                    uStack_fc4 = uStack_fdc;
                    uStack_fbc = context->user->instPrimID[0];
                    local_fc0 = uStack_fbc;
                    uStack_fb8 = uStack_fbc;
                    uStack_fb4 = uStack_fbc;
                    uStack_fb0 = uStack_fbc;
                    uStack_fac = uStack_fbc;
                    uStack_fa8 = uStack_fbc;
                    uStack_fa4 = uStack_fbc;
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_1220 + uVar22);
                    local_11e0 = local_10e0;
                    local_12e0 = local_11e0;
                    local_12d8 = pGVar25->userPtr;
                    local_12d0 = context->user;
                    local_12c0 = &local_10c0;
                    local_12b8 = 8;
                    pRVar10 = (RayHitK<8> *)pGVar25->intersectionFilterN;
                    local_12c8 = ray;
                    if (pRVar10 != (RayHitK<8> *)0x0) {
                      local_13e0._0_8_ = lVar21;
                      local_13c0 = auVar88._0_16_;
                      local_13d0 = auVar41._0_16_;
                      local_1360._0_8_ = pGVar25;
                      auVar58 = ZEXT1632(auVar57);
                      pRVar10 = (RayHitK<8> *)(*(code *)pRVar10)(&local_12e0);
                      auVar41 = ZEXT1664(local_13d0);
                      auVar88 = ZEXT1664(local_13c0);
                      pSVar16 = local_1398;
                      lVar21 = local_13e0._0_8_;
                      pGVar25 = (Geometry *)local_1360._0_8_;
                      ray = local_13a0;
                      k = local_13a8;
                    }
                    auVar40 = vpcmpeqd_avx2(local_11e0,_DAT_01faff00);
                    auVar58 = vpcmpeqd_avx2(auVar58,auVar58);
                    auVar51 = auVar58 & ~auVar40;
                    if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar51 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar51 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar51 >> 0x7f,0) == '\0') &&
                          (auVar51 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar51 >> 0xbf,0) == '\0') &&
                        (auVar51 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar51[0x1f]) {
                      auVar40 = auVar40 ^ auVar58;
                    }
                    else {
                      pRVar10 = (RayHitK<8> *)context->args->filter;
                      if ((pRVar10 != (RayHitK<8> *)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar25->field_8).field_0x2 & 0x40) != 0)))) {
                        local_13e0._0_8_ = lVar21;
                        local_13c0 = auVar88._0_16_;
                        local_13d0 = auVar41._0_16_;
                        auVar58 = ZEXT1632(auVar58._0_16_);
                        pRVar10 = (RayHitK<8> *)(*(code *)pRVar10)(&local_12e0);
                        auVar41 = ZEXT1664(local_13d0);
                        auVar88 = ZEXT1664(local_13c0);
                        pSVar16 = local_1398;
                        lVar21 = local_13e0._0_8_;
                        ray = local_13a0;
                        k = local_13a8;
                      }
                      auVar5 = vpcmpeqd_avx2(local_11e0,_DAT_01faff00);
                      auVar58 = vpcmpeqd_avx2(auVar58,auVar58);
                      auVar40 = auVar5 ^ auVar58;
                      auVar51 = auVar58 & ~auVar5;
                      if ((((((((auVar51 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar51 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar51 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar51 >> 0x7f,0) != '\0') ||
                            (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar51 >> 0xbf,0) != '\0') ||
                          (auVar51 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar51[0x1f] < '\0') {
                        auVar52._0_4_ = auVar5._0_4_ ^ auVar58._0_4_;
                        auVar52._4_4_ = auVar5._4_4_ ^ auVar58._4_4_;
                        auVar52._8_4_ = auVar5._8_4_ ^ auVar58._8_4_;
                        auVar52._12_4_ = auVar5._12_4_ ^ auVar58._12_4_;
                        auVar52._16_4_ = auVar5._16_4_ ^ auVar58._16_4_;
                        auVar52._20_4_ = auVar5._20_4_ ^ auVar58._20_4_;
                        auVar52._24_4_ = auVar5._24_4_ ^ auVar58._24_4_;
                        auVar52._28_4_ = auVar5._28_4_ ^ auVar58._28_4_;
                        auVar51 = vmaskmovps_avx(auVar52,*local_12c0);
                        *(undefined1 (*) [32])(local_12c8 + 0x180) = auVar51;
                        auVar51 = vmaskmovps_avx(auVar52,local_12c0[1]);
                        *(undefined1 (*) [32])(local_12c8 + 0x1a0) = auVar51;
                        auVar51 = vmaskmovps_avx(auVar52,local_12c0[2]);
                        *(undefined1 (*) [32])(local_12c8 + 0x1c0) = auVar51;
                        auVar51 = vmaskmovps_avx(auVar52,local_12c0[3]);
                        *(undefined1 (*) [32])(local_12c8 + 0x1e0) = auVar51;
                        auVar51 = vmaskmovps_avx(auVar52,local_12c0[4]);
                        *(undefined1 (*) [32])(local_12c8 + 0x200) = auVar51;
                        auVar51 = vpmaskmovd_avx2(auVar52,local_12c0[5]);
                        *(undefined1 (*) [32])(local_12c8 + 0x220) = auVar51;
                        auVar51 = vpmaskmovd_avx2(auVar52,local_12c0[6]);
                        *(undefined1 (*) [32])(local_12c8 + 0x240) = auVar51;
                        auVar51 = vpmaskmovd_avx2(auVar52,local_12c0[7]);
                        *(undefined1 (*) [32])(local_12c8 + 0x260) = auVar51;
                        auVar51 = vpmaskmovd_avx2(auVar52,local_12c0[8]);
                        *(undefined1 (*) [32])(local_12c8 + 0x280) = auVar51;
                        pRVar10 = local_12c8;
                      }
                    }
                    if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar40 >> 0x7f,0) == '\0') &&
                          (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar40 >> 0xbf,0) == '\0') &&
                        (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar40[0x1f]) {
                      *(int *)(ray + k * 4 + 0x100) = auVar41._0_4_;
                    }
                    else {
                      auVar41 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                    }
                    *(undefined4 *)(local_1350 + lVar21 * 4) = 0;
                    uVar8 = auVar41._0_4_;
                    auVar39._4_4_ = uVar8;
                    auVar39._0_4_ = uVar8;
                    auVar39._8_4_ = uVar8;
                    auVar39._12_4_ = uVar8;
                    auVar38 = vcmpps_avx(auVar88._0_16_,auVar39,2);
                    local_1350 = vandps_avx(auVar38,local_1350);
                  }
                  if ((((local_1350 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_1350 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_1350 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_1350[0xf]) break;
                  auVar50._8_4_ = 0x7f800000;
                  auVar50._0_8_ = 0x7f8000007f800000;
                  auVar50._12_4_ = 0x7f800000;
                  auVar38 = vblendvps_avx(auVar50,auVar88._0_16_,local_1350);
                  auVar43 = vshufps_avx(auVar38,auVar38,0xb1);
                  auVar43 = vminps_avx(auVar43,auVar38);
                  auVar59 = vshufpd_avx(auVar43,auVar43,1);
                  auVar43 = vminps_avx(auVar59,auVar43);
                  auVar43 = vcmpps_avx(auVar38,auVar43,0);
                  auVar59 = local_1350 & auVar43;
                  auVar38 = local_1350;
                  if ((((auVar59 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar59 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar59 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar59[0xf] < '\0') {
                    auVar38 = vandps_avx(auVar43,local_1350);
                  }
                  auVar38 = vpcmpgtd_avx(ZEXT816(0) << 0x20,auVar38);
                } while( true );
              }
            }
          }
          local_12f8 = local_12f8 + 1;
        } while (local_12f8 != local_1300);
      }
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar41 = ZEXT1664(CONCAT412(uVar8,CONCAT48(uVar8,CONCAT44(uVar8,uVar8))));
      auVar95 = ZEXT1664(local_1130);
      auVar96 = ZEXT1664(local_1140);
      auVar103 = ZEXT1664(local_1150);
      auVar88 = ZEXT1664(local_12b0);
      uVar22 = local_13e8;
      fVar104 = local_1160;
      fVar106 = fStack_115c;
      fVar107 = fStack_1158;
      fVar108 = fStack_1154;
      fVar109 = local_1170;
      fVar110 = fStack_116c;
      fVar111 = fStack_1168;
      fVar112 = fStack_1164;
      fVar113 = local_1180;
      fVar126 = fStack_117c;
      fVar129 = fStack_1178;
      fVar115 = fStack_1174;
      fVar131 = local_1190;
      fVar133 = fStack_118c;
      fVar118 = fStack_1188;
      fVar119 = fStack_1184;
      fVar120 = local_11a0;
      fVar123 = fStack_119c;
      fVar124 = fStack_1198;
      fVar125 = fStack_1194;
      fVar127 = local_11b0;
      fVar130 = fStack_11ac;
      fVar132 = fStack_11a8;
      fVar134 = fStack_11a4;
    }
    if (pauVar9 == (undefined1 (*) [16])&local_fa0) {
      return;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }